

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_union_struct(flatcc_union_verifier_descriptor_t *ud,size_t size,uint16_t align)

{
  int iVar1;
  uint16_t align_local;
  size_t size_local;
  flatcc_union_verifier_descriptor_t *ud_local;
  
  iVar1 = verify_struct(ud->end,ud->base,ud->offset,(flatbuffers_uoffset_t)size,align);
  return iVar1;
}

Assistant:

int flatcc_verify_union_struct(flatcc_union_verifier_descriptor_t *ud, size_t size, uint16_t align)
{
    return verify_struct(ud->end, ud->base, ud->offset, (uoffset_t)size, align);
}